

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

QFontEngine * __thiscall QFontEngineMulti::loadEngine(QFontEngineMulti *this,int at)

{
  QFontDef *in_RDI;
  long in_FS_OFFSET;
  QFontEngine *engine;
  QFontDef request;
  QFontDef *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QFontEngine *local_a8;
  undefined1 in_stack_ffffffffffffff73;
  int in_stack_ffffffffffffff74;
  QFontDef *in_stack_ffffffffffffff78;
  undefined1 local_70 [96];
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_70,&DAT_00bcc948,0x68);
  QFontDef::QFontDef(in_RDI,in_stack_ffffffffffffff28);
  local_10 = local_10 & 0xffffffffffff0000 | (ulong)((uint)local_10 & 0xffff | 0x8000);
  fallbackFamilyAt((QFontEngineMulti *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                   ,(int)((ulong)in_RDI >> 0x20));
  QList<QString>::QList<QString,void>(&in_RDI->families,(QString *)in_stack_ffffffffffffff28);
  QList<QString>::operator=(&in_RDI->families,&in_stack_ffffffffffffff28->families);
  QList<QString>::~QList((QList<QString> *)0x76425d);
  QString::~QString((QString *)0x764267);
  local_a8 = QFontDatabasePrivate::findFont
                       (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                        (bool)in_stack_ffffffffffffff73);
  if (local_a8 == (QFontEngine *)0x0) {
    local_a8 = (QFontEngine *)0x0;
  }
  else {
    *(ulong *)&(local_a8->fontDef).field_0x60 =
         *(ulong *)&(local_a8->fontDef).field_0x60 & 0xfffc00ffffffffff |
         (ulong)((uint)(local_10 >> 0x28) & 0x3ff) << 0x28;
    if ((local_10 >> 0x1c & 3) != 0) {
      *(ulong *)&(local_a8->fontDef).field_0x60 =
           *(ulong *)&(local_a8->fontDef).field_0x60 & 0xffffffffcfffffff |
           (ulong)((uint)(local_10 >> 0x1c) & 3) << 0x1c;
    }
  }
  QFontDef::~QFontDef(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a8;
}

Assistant:

QFontEngine *QFontEngineMulti::loadEngine(int at)
{
    QFontDef request(fontDef);
    request.styleStrategy |= QFont::NoFontMerging;
    request.families = QStringList(fallbackFamilyAt(at - 1));

    // At this point, the main script of the text has already been considered
    // when fetching the list of fallback families from the database, and the
    // info about the actual script of the characters may have been discarded,
    // so we do not check for writing system support, but instead just load
    // the family indiscriminately.
    if (QFontEngine *engine = QFontDatabasePrivate::findFont(request, QFontDatabasePrivate::Script_Common)) {
        engine->fontDef.weight = request.weight;
        if (request.style > QFont::StyleNormal)
            engine->fontDef.style = request.style;
        return engine;
    }

    return nullptr;
}